

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O3

void * parseDictionary(SymbolContext<char> *ctx)

{
  undefined8 *puVar1;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var2;
  undefined4 *puVar3;
  long lVar4;
  
  p_Var2 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)operator_new(0x38);
  *(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    **)p_Var2 = p_Var2 + 0x30;
  *(undefined8 *)(p_Var2 + 8) = 1;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = 0;
  *(undefined8 *)(p_Var2 + 0x28) = 0;
  *(undefined4 *)(p_Var2 + 0x20) = 0x3f800000;
  *(undefined8 *)(p_Var2 + 0x28) = 0;
  *(undefined8 *)(p_Var2 + 0x30) = 0;
  if (0 < ctx->num_values) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)ctx->values[lVar4];
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,JSONValue>(p_Var2,puVar1,(JSONValue *)(puVar1 + 4));
      JSONValue::~JSONValue((JSONValue *)(puVar1 + 4));
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
      lVar4 = lVar4 + 1;
    } while (lVar4 < ctx->num_values);
  }
  puVar3 = (undefined4 *)operator_new(0x10);
  *puVar3 = 5;
  *(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    **)(puVar3 + 2) = p_Var2;
  return puVar3;
}

Assistant:

void *parseDictionary(const SymbolContext<char>& ctx)
{
    JSONObject *o = new JSONObject();
    for (int i = 1; i <= ctx.count(); i++)
    {
        std::pair<JSONString, JSONValue> *p = ctx.value<std::pair<JSONString, JSONValue> >(i);
        o->emplace(p->first, std::move(p->second));
        delete p;
    }
    return new JSONValue(o);
}